

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

void __thiscall SQOuter::~SQOuter(SQOuter *this)

{
  SQWeakRef *pSVar1;
  
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQOuter_0013a798;
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
  }
  SQObjectPtr::~SQObjectPtr(&this->_value);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQRefCounted_0013a570;
  pSVar1 = (this->super_SQCollectable).super_SQRefCounted._weakref;
  if (pSVar1 != (SQWeakRef *)0x0) {
    (pSVar1->_obj)._type = OT_NULL;
    (pSVar1->_obj)._unVal.pTable = (SQTable *)0x0;
  }
  return;
}

Assistant:

~SQOuter() { REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this); }